

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mipsdsp_accinsn(DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2
                        ,int check_ret)

{
  uint uVar1;
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_ptr pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i64 local_40;
  TCGv_ptr local_38;
  
  if (check_ret == 1 && ret == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,v1);
  gen_load_gpr(tcg_ctx,t_00,v2);
  if (op1 != 0x7c00003c) {
    if (op1 != 0x7c000038) goto switchD_0088fbcf_caseD_8;
    check_dsp(ctx);
    switch((op2 + 0x83ffffc8) * 0x4000000 | op2 + 0x83ffffc8 >> 6) {
    case 0:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = ret_01;
      goto LAB_0088fda4;
    case 1:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = t;
LAB_0088fda4:
      gen_helper_extr_w(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
      break;
    case 2:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = ret_01;
      goto LAB_0088fe80;
    case 3:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = t;
LAB_0088fe80:
      gen_helper_extp(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
      break;
    case 4:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = ret_01;
      goto LAB_0088fdda;
    case 5:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = t;
LAB_0088fdda:
      gen_helper_extr_r_w(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
      break;
    case 6:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = ret_01;
      goto LAB_0088fef0;
    case 7:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = t;
LAB_0088fef0:
      gen_helper_extr_rs_w(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
      break;
    case 10:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = ret_01;
      goto LAB_0088ffcb;
    case 0xb:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = t;
LAB_0088ffcb:
      gen_helper_extpdp(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
      break;
    case 0xe:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = ret_01;
      goto LAB_0088fe10;
    case 0xf:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
      pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
      pTVar2 = tcg_ctx->cpu_env;
      pTVar3 = t;
LAB_0088fe10:
      gen_helper_extr_s_h(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
      break;
    case 0x12:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(*(ushort *)((long)&ctx->opcode + 2) & 0x3ff))
      ;
      gen_helper_rddsp(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],ret_00,tcg_ctx->cpu_env);
      break;
    case 0x13:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(ctx->opcode >> 0xb & 0x3ff));
      gen_helper_wrdsp(tcg_ctx,t,ret_00,tcg_ctx->cpu_env);
      break;
    case 0x1a:
      uVar1 = ctx->opcode;
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)ret);
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uVar1 >> 0x14 & 0x3f));
      pTVar2 = tcg_ctx->cpu_env;
      pTVar4 = ret_01;
      goto LAB_0088ff5b;
    case 0x1b:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)ret);
      pTVar2 = tcg_ctx->cpu_env;
      pTVar4 = t;
LAB_0088ff5b:
      gen_helper_shilo(tcg_ctx,ret_00,pTVar4,pTVar2);
      break;
    case 0x1f:
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)ret);
      gen_helper_mthlip(tcg_ctx,ret_00,t,tcg_ctx->cpu_env);
    }
    goto switchD_0088fbcf_caseD_8;
  }
  check_dsp(ctx);
  switch((op2 + 0x83ffffc4) * 0x4000000 | op2 + 0x83ffffc4 >> 6) {
  case 0:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_008901c1;
  case 1:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_008901c1:
    gen_helper_dextr_w(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 2:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_008902d7;
  case 3:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_008902d7:
    gen_helper_dextp(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 4:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_00890319;
  case 5:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_00890319:
    gen_helper_dextr_r_w(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 6:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_00890231;
  case 7:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_00890231:
    gen_helper_dextr_rs_w(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 10:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_00890389;
  case 0xb:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_00890389:
    gen_helper_dextpdp(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 0xe:
  case 0xf:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    gen_helper_dextr_s_h(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],ret_00,ret_01,tcg_ctx->cpu_env);
    break;
  case 0x10:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_008900ae;
  case 0x11:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_008900ae:
    gen_helper_dextr_l(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 0x14:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_008902a1;
  case 0x15:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_008902a1:
    gen_helper_dextr_r_l(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 0x16:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uint)v1);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = ret_01;
    goto LAB_008903f9;
  case 0x17:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)v2);
    pTVar4 = tcg_ctx->cpu_gpr[(uint)ret];
    pTVar2 = tcg_ctx->cpu_env;
    pTVar3 = t;
LAB_008903f9:
    gen_helper_dextr_rs_l(tcg_ctx,pTVar4,ret_00,pTVar3,pTVar2);
    break;
  case 0x1a:
    uVar1 = ctx->opcode;
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uVar1 >> 0x13 & 0x7f));
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_01,(ulong)(uVar1 >> 0xb & 3));
    pTVar2 = tcg_ctx->cpu_env;
    pTVar4 = ret_01;
    pTVar3 = ret_00;
    goto LAB_00890120;
  case 0x1b:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(ctx->opcode >> 0xb & 3));
    pTVar2 = tcg_ctx->cpu_env;
    pTVar4 = ret_00;
    pTVar3 = t;
LAB_00890120:
    gen_helper_dshilo(tcg_ctx,pTVar3,pTVar4,pTVar2);
    break;
  case 0x1f:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret_00,(ulong)(uint)ret);
    local_38 = tcg_ctx->cpu_env + (long)tcg_ctx;
    local_48 = (TCGTemp *)(t + (long)tcg_ctx);
    local_40 = ret_00 + (long)&tcg_ctx->pool_cur;
    tcg_gen_callN_mips64el(tcg_ctx,helper_dmthlip_mips64el,(TCGTemp *)0x0,3,&local_48);
  }
switchD_0088fbcf_caseD_8:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mipsdsp_accinsn(DisasContext *ctx, uint32_t op1, uint32_t op2,
                                int ret, int v1, int v2, int check_ret)

{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv t1;
    TCGv v1_t;
    TCGv v2_t;
    int16_t imm;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    case OPC_EXTR_W_DSP:
        check_dsp(ctx);
        switch (op2) {
        case OPC_EXTR_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPDP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPDPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_SHILO:
            imm = (ctx->opcode >> 20) & 0x3F;
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            tcg_gen_movi_tl(tcg_ctx, t1, imm);
            gen_helper_shilo(tcg_ctx, t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_SHILOV:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_shilo(tcg_ctx, t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_MTHLIP:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_mthlip(tcg_ctx, t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_WRDSP:
            imm = (ctx->opcode >> 11) & 0x3FF;
            tcg_gen_movi_tl(tcg_ctx, t0, imm);
            gen_helper_wrdsp(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
            break;
        case OPC_RDDSP:
            imm = (ctx->opcode >> 16) & 0x03FF;
            tcg_gen_movi_tl(tcg_ctx, t0, imm);
            gen_helper_rddsp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DEXTR_W_DSP:
        check_dsp(ctx);
        switch (op2) {
        case OPC_DMTHLIP:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_dmthlip(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
            break;
        case OPC_DSHILO:
            {
                int shift = (ctx->opcode >> 19) & 0x7F;
                int ac = (ctx->opcode >> 11) & 0x03;
                tcg_gen_movi_tl(tcg_ctx, t0, shift);
                tcg_gen_movi_tl(tcg_ctx, t1, ac);
                gen_helper_dshilo(tcg_ctx, t0, t1, tcg_ctx->cpu_env);
                break;
            }
        case OPC_DSHILOV:
            {
                int ac = (ctx->opcode >> 11) & 0x03;
                tcg_gen_movi_tl(tcg_ctx, t0, ac);
                gen_helper_dshilo(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
                break;
            }
        case OPC_DEXTP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);

            gen_helper_dextp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPDP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPDPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_R_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_r_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_RS_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_rs_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_R_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_r_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_RS_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_rs_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}